

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::SpectrumPtexTexture::Evaluate
          (SpectrumPtexTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  ulong uVar1;
  undefined8 uVar2;
  int iVar3;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar14 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar15 [16];
  SampledSpectrum SVar16;
  RGB local_58;
  float local_48;
  undefined4 uStack_44;
  Float local_40;
  RGBIlluminantSpectrum local_38;
  RGB local_20;
  undefined1 auVar4 [16];
  undefined1 auVar10 [56];
  undefined1 auVar11 [64];
  
  iVar3 = PtexTextureBase::SampleTexture(&this->super_PtexTextureBase,ctx,&local_48);
  if (iVar3 == 1) {
    auVar6._4_4_ = local_48;
    auVar6._0_4_ = local_48;
    auVar6._8_4_ = local_48;
    auVar6._12_4_ = local_48;
  }
  else {
    auVar4._4_4_ = uStack_44;
    auVar4._0_4_ = local_48;
    auVar4._8_8_ = 0;
    auVar14 = ZEXT856(0);
    auVar10 = (undefined1  [56])0x0;
    local_58.b = local_40;
    if (this->spectrumType == Albedo) {
      uVar1 = vcmpps_avx512vl(auVar4,ZEXT816(0) << 0x40,5);
      auVar15._8_4_ = 0x3f800000;
      auVar15._0_8_ = 0x3f8000003f800000;
      auVar15._12_4_ = 0x3f800000;
      auVar4 = vminps_avx512vl(auVar15,auVar4);
      auVar5._4_4_ = (uint)((byte)(uVar1 >> 1) & 1) * auVar4._4_4_;
      auVar5._0_4_ = (uint)((byte)uVar1 & 1) * auVar4._0_4_;
      auVar5._8_4_ = (uint)((byte)(uVar1 >> 2) & 1) * auVar4._8_4_;
      auVar5._12_4_ = (uint)((byte)(uVar1 >> 3) & 1) * auVar4._12_4_;
      auVar14 = ZEXT856(auVar5._8_8_);
      auVar4 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)local_40));
      uVar2 = vcmpss_avx512f(ZEXT416((uint)local_40),ZEXT816(0) << 0x40,1);
      local_20.b = (Float)((uint)!(bool)((byte)uVar2 & 1) * auVar4._0_4_);
      local_20._0_8_ = vmovlps_avx(auVar5);
      RGBAlbedoSpectrum::RGBAlbedoSpectrum
                ((RGBAlbedoSpectrum *)&local_38,RGBColorSpace::sRGB,&local_20);
      SVar16 = RGBAlbedoSpectrum::Sample((RGBAlbedoSpectrum *)&local_38,&lambda);
      auVar12._0_8_ = SVar16.values.values._8_8_;
      auVar12._8_56_ = auVar14;
      auVar5 = auVar12._0_16_;
      auVar8._0_8_ = SVar16.values.values._0_8_;
      auVar8._8_56_ = auVar10;
      auVar4 = auVar8._0_16_;
    }
    else if (this->spectrumType == Unbounded) {
      RGBUnboundedSpectrum::RGBUnboundedSpectrum
                ((RGBUnboundedSpectrum *)&local_38,RGBColorSpace::sRGB,&local_58);
      SVar16 = RGBUnboundedSpectrum::Sample((RGBUnboundedSpectrum *)&local_38,&lambda);
      auVar11._0_8_ = SVar16.values.values._8_8_;
      auVar11._8_56_ = auVar14;
      auVar5 = auVar11._0_16_;
      auVar7._0_8_ = SVar16.values.values._0_8_;
      auVar7._8_56_ = auVar10;
      auVar4 = auVar7._0_16_;
    }
    else {
      RGBIlluminantSpectrum::RGBIlluminantSpectrum(&local_38,RGBColorSpace::sRGB,&local_58);
      SVar16 = RGBIlluminantSpectrum::Sample(&local_38,&lambda);
      auVar13._0_8_ = SVar16.values.values._8_8_;
      auVar13._8_56_ = auVar14;
      auVar5 = auVar13._0_16_;
      auVar9._0_8_ = SVar16.values.values._0_8_;
      auVar9._8_56_ = auVar10;
      auVar4 = auVar9._0_16_;
    }
    auVar6 = vmovlhps_avx(auVar4,auVar5);
  }
  auVar4 = vshufpd_avx(auVar6,auVar6,1);
  SVar16.values.values._0_8_ = auVar6._0_8_;
  SVar16.values.values._8_8_ = auVar4._0_8_;
  return (SampledSpectrum)SVar16.values.values;
}

Assistant:

SampledSpectrum SpectrumPtexTexture::Evaluate(TextureEvalContext ctx,
                                              SampledWavelengths lambda) const {
#ifdef PBRT_IS_GPU_CODE
    LOG_FATAL("Ptex not supported with GPU renderer");
    return SampledSpectrum(0);
#else
    float result[3];
    int nc = SampleTexture(ctx, result);
    if (nc == 1)
        return SampledSpectrum(result[0]);
    DCHECK_EQ(3, nc);
    RGB rgb(result[0], result[1], result[2]);
    if (spectrumType == SpectrumType::Unbounded)
        return RGBUnboundedSpectrum(*RGBColorSpace::sRGB, rgb).Sample(lambda);
    else if (spectrumType == SpectrumType::Albedo)
        return RGBAlbedoSpectrum(*RGBColorSpace::sRGB, Clamp(rgb, 0, 1)).Sample(lambda);
    else
        return RGBIlluminantSpectrum(*RGBColorSpace::sRGB, rgb).Sample(lambda);
#endif
}